

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_ManSaveResults(Kf_Cut_t **ppCuts,int nCuts,Kf_Cut_t *pCutBest,Vec_Int_t *vTemp)

{
  int iVar1;
  int local_30;
  int local_2c;
  int k;
  int i;
  Vec_Int_t *vTemp_local;
  Kf_Cut_t *pCutBest_local;
  int nCuts_local;
  Kf_Cut_t **ppCuts_local;
  
  if ((nCuts < 1) || (0x1f < nCuts)) {
    __assert_fail("nCuts > 0 && nCuts < KF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0xce,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
  }
  Kf_ManStoreStart(vTemp,nCuts);
  for (local_2c = 0; local_2c < nCuts; local_2c = local_2c + 1) {
    if (ppCuts[local_2c] == pCutBest) {
      iVar1 = Vec_IntSize(vTemp);
      Vec_IntWriteEntry(vTemp,1,iVar1);
    }
    Vec_IntPush(vTemp,ppCuts[local_2c]->nLeaves);
    for (local_30 = 0; local_30 < ppCuts[local_2c]->nLeaves; local_30 = local_30 + 1) {
      iVar1 = Abc_Var2Lit(ppCuts[local_2c]->pLeaves[local_30],0);
      Vec_IntPush(vTemp,iVar1);
    }
    Vec_IntPush(vTemp,ppCuts[local_2c]->iFunc);
    Vec_IntPush(vTemp,ppCuts[local_2c]->Delay);
    iVar1 = Abc_Float2Int(ppCuts[local_2c]->Area);
    Vec_IntPush(vTemp,iVar1);
  }
  iVar1 = Vec_IntEntry(vTemp,1);
  if (0 < iVar1) {
    return;
  }
  __assert_fail("Vec_IntEntry(vTemp, 1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                ,0xdc,"void Kf_ManSaveResults(Kf_Cut_t **, int, Kf_Cut_t *, Vec_Int_t *)");
}

Assistant:

static inline void Kf_ManSaveResults( Kf_Cut_t ** ppCuts, int nCuts, Kf_Cut_t * pCutBest, Vec_Int_t * vTemp )
{
    int i, k;
    assert( nCuts > 0 && nCuts < KF_CUT_MAX );
    Kf_ManStoreStart( vTemp, nCuts );
    for ( i = 0; i < nCuts; i++ )
    {
        if ( ppCuts[i] == pCutBest )
            Vec_IntWriteEntry( vTemp, 1, Vec_IntSize(vTemp) );
        Vec_IntPush( vTemp, ppCuts[i]->nLeaves );
//        Vec_IntPushArray( vTemp, ppCuts[i]->pLeaves, ppCuts[i]->nLeaves );
        for ( k = 0; k < ppCuts[i]->nLeaves; k++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(ppCuts[i]->pLeaves[k], 0) );
        Vec_IntPush( vTemp, ppCuts[i]->iFunc );
        Vec_IntPush( vTemp, ppCuts[i]->Delay );
        Vec_IntPush( vTemp, Abc_Float2Int(ppCuts[i]->Area) );
    }
    assert( Vec_IntEntry(vTemp, 1) > 0 );
}